

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O1

_Bool monster_group_change_index(chunk_conflict *c,wchar_t new,wchar_t old)

{
  wchar_t wVar1;
  monster_group *pmVar2;
  monster_group *pmVar3;
  monster *pmVar4;
  mon_group_list_entry *pmVar5;
  
  pmVar4 = cave_monster(c,old);
  wVar1 = pmVar4->group_info[0].index;
  pmVar4 = cave_monster(c,old);
  pmVar2 = c->monster_groups[wVar1];
  pmVar3 = c->monster_groups[pmVar4->group_info[1].index];
  pmVar5 = pmVar2->member_list;
  if (pmVar2->leader == old) {
    pmVar2->leader = new;
  }
  while( true ) {
    if (pmVar5 == (mon_group_list_entry *)0x0) {
      if (pmVar3 != (monster_group *)0x0) {
        if (pmVar3->leader == old) {
          pmVar3->leader = new;
        }
        for (pmVar5 = pmVar3->member_list; pmVar5 != (mon_group_list_entry *)0x0;
            pmVar5 = pmVar5->next) {
          if (pmVar5->midx == old) {
            pmVar5->midx = new;
            return true;
          }
        }
      }
      return false;
    }
    if ((pmVar5->midx == old) && (pmVar5->midx = new, pmVar3 == (monster_group *)0x0)) break;
    pmVar5 = pmVar5->next;
  }
  return true;
}

Assistant:

bool monster_group_change_index(struct chunk *c, int new, int old)
{
	int index0 = cave_monster(c, old)->group_info[PRIMARY_GROUP].index;
	int index1 = cave_monster(c, old)->group_info[SUMMON_GROUP].index;
	struct monster_group *group0 = monster_group_by_index(c, index0);
	struct monster_group *group1 = monster_group_by_index(c, index1);
	struct mon_group_list_entry *entry = group0->member_list;

	if (group0->leader == old) {
		group0->leader = new;
	}
	while (entry) {
		if (entry->midx == old) {
			entry->midx = new;
			if (!group1) {
				return true;
			}
		}
		entry = entry->next;
	}

	if (group1) {
		if (group1->leader == old) {
			group1->leader = new;
		}
		entry = group1->member_list;
		while (entry) {
			if (entry->midx == old) {
				entry->midx = new;
				return true;
			}
			entry = entry->next;
		}
	}

	return false;
}